

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundFMOD.cpp
# Opt level: O1

void __thiscall
XPMP2::SoundSystemFMOD::SetPosOrientation
          (SoundSystemFMOD *this,uint64_t sndId,Aircraft *ac,bool bDoOrientation)

{
  SoundFile *pSVar1;
  undefined1 auVar2 [16];
  FMOD_RESULT FVar3;
  SoundChannel *pSVar4;
  undefined4 uVar5;
  int iVar6;
  undefined7 in_register_00000009;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  float fVar8;
  FMOD_VECTOR FVar9;
  string local_140;
  string local_120;
  float local_100;
  float local_fc;
  string local_f8;
  undefined **local_d8 [3];
  _Alloc_hider local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Alloc_hider local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined8 local_60;
  float local_58;
  undefined8 local_50;
  float local_48;
  undefined8 local_40;
  float local_38;
  
  uVar5 = (undefined4)CONCAT71(in_register_00000009,bDoOrientation);
  pSVar4 = SoundSystem::GetChn(&this->super_SoundSystem,sndId);
  if (((pSVar4 != (SoundChannel *)0x0) && (pSVar4->pChn != (FMOD_CHANNEL *)0x0)) &&
     (pSVar4->pSnd != (SoundFile *)0x0)) {
    local_40._0_4_ = (ac->drawInfo).x;
    local_40._4_4_ = (ac->drawInfo).y;
    local_38 = (ac->drawInfo).z;
    local_50._0_4_ = ac->v_x;
    local_50._4_4_ = ac->v_y;
    local_48 = ac->v_z;
    gFmodRes = FMOD_Channel_Set3DAttributes(pSVar4->pChn);
    if (gFmodRes != FMOD_OK) {
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_120,"FMOD_Channel_Set3DAttributes(pChn->pChn, &fmodPos, &fmodVel)"
                 ,"");
      FVar3 = gFmodRes;
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_140,
                 "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
                 ,"");
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"SetPosOrientation","");
      FmodError::FmodError((FmodError *)local_d8,&local_120,FVar3,&local_140,0x175,&local_f8);
      FmodError::LogErr((FmodError *)local_d8);
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)&((FmodError *)local_d8)->sFunc + 0x10);
      local_d8[0] = &PTR__FmodError_002e0a18;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_p != paVar7) {
        operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
      }
      uVar5 = SUB84(paVar7,0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)((long)&((FmodError *)local_d8)->sFile + 0x10U)) {
        operator_delete(local_c0._M_p,local_b0._M_allocated_capacity + 1);
      }
      std::runtime_error::~runtime_error((runtime_error *)local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
    }
    if (bDoOrientation) {
      pSVar1 = pSVar4->pSnd;
      fStack_74 = pSVar1->conePitch;
      fStack_70 = pSVar1->coneInAngle;
      fStack_6c = pSVar1->coneOutAngle;
      auVar2._4_4_ = -(uint)NAN(fStack_74);
      auVar2._0_4_ = -(uint)NAN(pSVar1->coneDir);
      auVar2._8_4_ = -(uint)NAN(fStack_70);
      auVar2._12_4_ = -(uint)NAN(fStack_6c);
      iVar6 = movmskps(uVar5,auVar2);
      if ((iVar6 == 0) && (!NAN(pSVar1->coneOutVol))) {
        local_78 = (pSVar1->coneDir * 3.1415927) / 180.0;
        local_fc = (ac->drawInfo).heading + pSVar4->pSnd->coneDir;
        local_100 = cosf(local_78);
        local_100 = local_100 * (ac->drawInfo).pitch;
        fVar8 = sinf(local_78);
        FVar9 = FmodHeadPitch2Vec(local_fc,(local_100 - fVar8 * (ac->drawInfo).roll) +
                                           pSVar4->pSnd->conePitch);
        local_58 = FVar9.z;
        local_60 = FVar9._0_8_;
        gFmodRes = FMOD_Channel_Set3DConeOrientation(pSVar4->pChn);
        if (gFmodRes != FMOD_OK) {
          local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_120,"FMOD_Channel_Set3DConeOrientation(pChn->pChn, &coneVec)",
                     "");
          FVar3 = gFmodRes;
          local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_140,
                     "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
                     ,"");
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_f8,"SetPosOrientation","");
          FmodError::FmodError((FmodError *)local_d8,&local_120,FVar3,&local_140,0x181,&local_f8);
          FmodError::LogErr((FmodError *)local_d8);
          local_d8[0] = &PTR__FmodError_002e0a18;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((long)&((FmodError *)local_d8)->sFunc + 0x10U)) {
            operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((long)&((FmodError *)local_d8)->sFile + 0x10U)) {
            operator_delete(local_c0._M_p,local_b0._M_allocated_capacity + 1);
          }
          std::runtime_error::~runtime_error((runtime_error *)local_d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != &local_140.field_2) {
            operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2) {
            operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void SoundSystemFMOD::SetPosOrientation (uint64_t sndId, const Aircraft& ac, bool bDoOrientation)
{
    SoundChannel* pChn = GetChn(sndId);
    if (!pChn || !pChn->pChn || !pChn->pSnd ) return;
    
    // Aircraft position and velocity
    FMOD_VECTOR fmodPos {                           // Copy of the aircraft's 3D location
        ac.drawInfo.x,
        ac.drawInfo.y,
        ac.drawInfo.z,
    };
    FMOD_VECTOR fmodVel { ac.v_x, ac.v_y, ac.v_z }; // Copy of the aircraft's relative speed
    FMOD_LOG(FMOD_Channel_Set3DAttributes(pChn->pChn, &fmodPos, &fmodVel));
    
    // Do the (computationally more expensive) orientation stuff?
    if (!bDoOrientation ||
        !pChn->pSnd->hasConeInfo()) return;
    
    // Calculate current cone orientation based on standard orientation and aircraft orientation
    const float coneDirRad = deg2rad(pChn->pSnd->coneDir);
    FMOD_VECTOR coneVec = FmodHeadPitch2Vec(ac.GetHeading() + pChn->pSnd->coneDir,
                                            std::cos(coneDirRad)*ac.GetPitch() - std::sin(coneDirRad)*ac.GetRoll() + pChn->pSnd->conePitch);

    // Set cone info and orientation
    FMOD_LOG(FMOD_Channel_Set3DConeOrientation(pChn->pChn, &coneVec));
}